

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

int is_undirected_automorphism(saucy *s)

{
  Abc_Ntk_t *pNtk1;
  int *piVar1;
  undefined8 *__ptr;
  int iVar2;
  uint uVar3;
  Abc_Ntk_t *pMiter;
  int *__ptr_00;
  Abc_Ntk_t *pNtk;
  sim_result *psVar4;
  ulong uVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  ulong uVar8;
  char *__s;
  long lVar9;
  double dVar10;
  
  if (0 < s->ndiffs) {
    lVar9 = 0;
    do {
      iVar2 = check_mapping(s,s->adj,s->edg,s->unsupp[lVar9]);
      if (iVar2 == 0) {
        return 0;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < s->ndiffs);
  }
  pNtk1 = s->pNtk;
  piVar1 = s->pModel;
  pMiter = Abc_NtkMiter(pNtk1,s->pNtk_permuted,1,0,0,0);
  if (pMiter == (Abc_Ntk_t *)0x0) {
    __s = "Miter computation has failed.";
    goto LAB_003099c7;
  }
  iVar2 = Abc_NtkMiterIsConstant(pMiter);
  if (iVar2 != 1) {
    if (iVar2 == 0) {
      __ptr_00 = Abc_NtkVerifyGetCleanModel(pMiter,1);
      pMiter->pModel = __ptr_00;
      pVVar6 = pNtk1->vPis;
      if (0 < pVVar6->nSize) {
        lVar9 = 0;
        do {
          piVar1[lVar9] = __ptr_00[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar6->nSize);
      }
      iVar2 = 0;
      pNtk = pMiter;
      if (__ptr_00 == (int *)0x0) goto LAB_00309820;
    }
    else {
      pNtk = Abc_NtkMulti(pMiter,0,100,1,0,0,0);
      Abc_NtkDelete(pMiter);
      if (pNtk == (Abc_Ntk_t *)0x0) {
        __s = "Renoding for CNF has failed.";
LAB_003099c7:
        puts(__s);
        exit(1);
      }
      iVar2 = Abc_NtkMiterSat(pNtk,10000,0,0,(ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
      if (iVar2 == -1) {
        __s = "Networks are undecided (SAT solver timed out).";
        goto LAB_003099c7;
      }
      __ptr_00 = pNtk->pModel;
      pMiter = pNtk;
      if (__ptr_00 == (int *)0x0) goto LAB_00309820;
      pVVar6 = pNtk1->vPis;
      if (0 < pVVar6->nSize) {
        lVar9 = 0;
        do {
          piVar1[lVar9] = __ptr_00[lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar6->nSize);
      }
    }
    free(__ptr_00);
    pNtk->pModel = (int *)0x0;
    pMiter = pNtk;
  }
LAB_00309820:
  Abc_NtkDelete(pMiter);
  if (iVar2 == 0) {
    psVar4 = analyzeConflict(s->pNtk,s->pModel,s->fPrintTree);
    add_conterexample(s,psVar4);
    psVar4 = analyzeConflict(s->pNtk_permuted,s->pModel,s->fPrintTree);
    add_conterexample(s,psVar4);
    dVar10 = s->activityInc * 1.1111111111111112;
    s->activityInc = dVar10;
    iVar7 = s->satCounterExamples->nSize;
    if (0x31 < iVar7) {
      dVar10 = dVar10 / (double)iVar7;
      do {
        pVVar6 = s->satCounterExamples;
        uVar3 = pVVar6->nSize;
        uVar5 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          iVar7 = 0;
        }
        else {
          lVar9 = 0;
          uVar8 = 0;
          do {
            __ptr = (undefined8 *)pVVar6->pArray[lVar9];
            if (dVar10 < (double)__ptr[3] || dVar10 == (double)__ptr[3]) {
              iVar7 = (int)uVar8;
              if (iVar7 < lVar9) {
                if ((iVar7 < 0) || ((int)uVar5 <= iVar7)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
                }
                pVVar6->pArray[uVar8] = __ptr;
                uVar8 = (ulong)(iVar7 + 1);
              }
            }
            else {
              if ((void *)*__ptr != (void *)0x0) {
                free((void *)*__ptr);
                *__ptr = 0;
              }
              if ((void *)__ptr[1] != (void *)0x0) {
                free((void *)__ptr[1]);
                __ptr[1] = 0;
              }
              free(__ptr);
            }
            iVar7 = (int)uVar8;
            lVar9 = lVar9 + 1;
            pVVar6 = s->satCounterExamples;
            uVar3 = pVVar6->nSize;
            uVar5 = (ulong)(int)uVar3;
          } while (lVar9 < (long)uVar5);
        }
        if ((int)uVar3 < iVar7) {
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
        }
        pVVar6->nSize = iVar7;
        dVar10 = dVar10 + dVar10;
      } while (0x23 < s->satCounterExamples->nSize);
    }
  }
  return iVar2;
}

Assistant:

static int
is_undirected_automorphism(struct saucy *s)
{
    int i, j, ret;  

    for (i = 0; i < s->ndiffs; ++i) {
        j = s->unsupp[i];
        if (!check_mapping(s, s->adj, s->edg, j)) return 0;
    }

    ret = Abc_NtkCecSat_saucy(s->pNtk, s->pNtk_permuted, s->pModel);
    
    if( BACKTRACK_BY_SAT && !ret ) {
        struct sim_result * cex;

        cex = analyzeConflict( s->pNtk, s->pModel, s->fPrintTree );
        add_conterexample(s, cex);

        cex = analyzeConflict( s->pNtk_permuted, s->pModel, s->fPrintTree );
        add_conterexample(s, cex);      
        
        s->activityInc *= (1 / CLAUSE_DECAY);
        if (Vec_PtrSize(s->satCounterExamples) >= MAX_LEARNTS)
            reduceDB(s);
    }

    return ret;
}